

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

int ClipSegmentToLine(ClipVertex *vOut,ClipVertex *vIn,btVector3 *normal,btScalar offset)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int *piVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar7 = ((vIn->v).m_floats[2] * normal->m_floats[2] +
          (vIn->v).m_floats[0] * normal->m_floats[0] + (vIn->v).m_floats[1] * normal->m_floats[1]) -
          offset;
  fVar8 = (normal->m_floats[2] * vIn[1].v.m_floats[2] +
          normal->m_floats[0] * vIn[1].v.m_floats[0] + normal->m_floats[1] * vIn[1].v.m_floats[1]) -
          offset;
  if (fVar7 <= 0.0) {
    vOut->id = vIn->id;
    uVar1 = *(undefined8 *)((vIn->v).m_floats + 2);
    *(undefined8 *)(vOut->v).m_floats = *(undefined8 *)(vIn->v).m_floats;
    *(undefined8 *)((vOut->v).m_floats + 2) = uVar1;
  }
  uVar4 = (uint)(fVar7 <= 0.0);
  uVar5 = uVar4;
  if (fVar8 <= 0.0) {
    uVar5 = uVar4 + 1;
    vOut[uVar4].id = vIn[1].id;
    uVar1 = *(undefined8 *)(vIn[1].v.m_floats + 2);
    *(undefined8 *)vOut[uVar4].v.m_floats = *(undefined8 *)vIn[1].v.m_floats;
    *(undefined8 *)(vOut[uVar4].v.m_floats + 2) = uVar1;
  }
  if (fVar7 * fVar8 < 0.0) {
    fVar9 = fVar7 / (fVar7 - fVar8);
    fVar8 = (vIn->v).m_floats[2];
    uVar1 = *(undefined8 *)vIn[1].v.m_floats;
    uVar2 = *(undefined8 *)(vIn->v).m_floats;
    fVar10 = (float)uVar2;
    fVar11 = (float)((ulong)uVar2 >> 0x20);
    piVar6 = &vIn->id;
    if (fVar7 <= 0.0) {
      piVar6 = &vIn[1].id;
    }
    auVar3._4_4_ = fVar9 * ((float)((ulong)uVar1 >> 0x20) - fVar11) + fVar11;
    auVar3._0_4_ = fVar9 * ((float)uVar1 - fVar10) + fVar10;
    auVar3._8_4_ = (vIn[1].v.m_floats[2] - fVar8) * fVar9 + fVar8;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])vOut[uVar5].v.m_floats = auVar3;
    vOut[uVar5].id = *piVar6;
    uVar5 = uVar5 + 1;
  }
  return uVar5;
}

Assistant:

SIMD_FORCE_INLINE btScalar dot(const btVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return	m_floats[0] * v.m_floats[0] +
				m_floats[1] * v.m_floats[1] +
				m_floats[2] * v.m_floats[2];
#endif
	}